

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

int lgx_type_inference(lgx_type_t *src,lgx_type_t *dst)

{
  lgx_val_type_t lVar1;
  int iVar2;
  lgx_type_t *dst_local;
  lgx_type_t *src_local;
  
  lVar1 = dst->type;
  if (lVar1 == T_UNKNOWN) {
    src_local._4_4_ = lgx_type_dup(src,dst);
  }
  else if (lVar1 == T_ARRAY) {
    if (src->type == T_ARRAY) {
      src_local._4_4_ = lgx_type_inference(&((src->u).arr)->value,&((dst->u).arr)->value);
    }
    else {
      src_local._4_4_ = 1;
    }
  }
  else if (lVar1 == T_MAP) {
    if (src->type == T_MAP) {
      iVar2 = lgx_type_inference(&((src->u).arr)->value,&((dst->u).arr)->value);
      if (iVar2 == 0) {
        src_local._4_4_ = lgx_type_inference(&((src->u).map)->value,&((dst->u).map)->value);
      }
      else {
        src_local._4_4_ = 1;
      }
    }
    else {
      src_local._4_4_ = 1;
    }
  }
  else {
    src_local._4_4_ = lgx_type_cmp(src,dst);
  }
  return src_local._4_4_;
}

Assistant:

int lgx_type_inference(lgx_type_t* src, lgx_type_t* dst) {
    switch (dst->type) {
        case T_UNKNOWN:
            return lgx_type_dup(src, dst);
        case T_ARRAY:
            if (src->type != T_ARRAY) {
                return 1;
            }
            return lgx_type_inference(&src->u.arr->value, &dst->u.arr->value);
        case T_MAP:
            if (src->type != T_MAP) {
                return 1;
            }
            if (lgx_type_inference(&src->u.map->key, &dst->u.map->key)) {
                return 1;
            }
            return lgx_type_inference(&src->u.map->value, &dst->u.map->value);
        default:
            return lgx_type_cmp(src, dst);
    }
}